

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O1

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  ulong uVar1;
  anon_struct_16_2_20c6a2c5 *paVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  double dVar7;
  
  if (action == 1) {
    if (key == 0x54) {
      bVar6 = delay == 0;
      delay = (int)bVar6;
      pcVar5 = "disabled";
      if (bVar6) {
        pcVar5 = "enabled";
      }
      printf("Delay %s.\n",pcVar5);
      return;
    }
    if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
      return;
    }
    if (delay == 0) {
      command_callback(key);
      return;
    }
    if (commands[0].key == key) {
      bVar6 = true;
      lVar4 = 0;
    }
    else {
      paVar2 = commands;
      uVar1 = 0xffffffffffffffff;
      do {
        uVar3 = uVar1;
        paVar2 = paVar2 + 1;
        if (uVar3 == 6) {
          return;
        }
        uVar1 = uVar3 + 1;
      } while (paVar2->key != key);
      bVar6 = uVar3 + 1 < 7;
      lVar4 = uVar3 + 2;
    }
    if (bVar6) {
      dVar7 = glfwGetTime();
      commands[lVar4].time = dVar7;
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GL_TRUE);
            break;

        case GLFW_KEY_T:
            delay = !delay;
            printf("Delay %s.\n", delay ? "enabled" : "disabled");
            break;

        default:
        {
            if (delay)
            {
                int i = 0;

                while (i < CommandCount && commands[i].key != key)
                    i++;

                if (i < CommandCount)
                    commands[i].time = glfwGetTime();
            }
            else
            {
                command_callback(key);
            }
        }
        break;
    }
}